

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O3

Fad<double> * __thiscall
Fad<double>::operator=
          (Fad<double> *this,
          FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
          *fadexpr)

{
  uint uVar1;
  uint uVar2;
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_> *pFVar3;
  FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *pFVar4;
  bool bVar5;
  double *pdVar6;
  uint uVar7;
  ulong uVar8;
  value_type vVar9;
  
  pFVar3 = (fadexpr->fadexpr_).right_;
  uVar1 = (((fadexpr->fadexpr_).left_)->dx_).num_elts;
  pFVar4 = (pFVar3->fadexpr_).left_;
  uVar2 = (((pFVar4->fadexpr_).left_)->dx_).num_elts;
  uVar7 = (((pFVar4->fadexpr_).right_)->dx_).num_elts;
  if ((int)uVar7 < (int)uVar2) {
    uVar7 = uVar2;
  }
  uVar2 = (((pFVar3->fadexpr_).right_)->dx_).num_elts;
  if ((int)uVar7 <= (int)uVar2) {
    uVar7 = uVar2;
  }
  if ((int)uVar7 < (int)uVar1) {
    uVar7 = uVar1;
  }
  uVar1 = (this->dx_).num_elts;
  if (uVar7 == uVar1) {
    if (uVar7 == 0) goto LAB_00e05137;
    pdVar6 = (this->dx_).ptr_to_data;
  }
  else {
    if (uVar7 == 0) {
      if (uVar1 != 0) {
        pdVar6 = (this->dx_).ptr_to_data;
        if (pdVar6 != (double *)0x0) {
          operator_delete__(pdVar6);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
      goto LAB_00e05137;
    }
    if (uVar1 != 0) {
      pdVar6 = (this->dx_).ptr_to_data;
      if (pdVar6 != (double *)0x0) {
        operator_delete__(pdVar6);
      }
      (this->dx_).ptr_to_data = (double *)0x0;
    }
    (this->dx_).num_elts = uVar7;
    uVar8 = 0xffffffffffffffff;
    if (-1 < (int)uVar7) {
      uVar8 = (ulong)uVar7 << 3;
    }
    pdVar6 = (double *)operator_new__(uVar8);
    (this->dx_).ptr_to_data = pdVar6;
  }
  bVar5 = FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>
          ::hasFastAccess(&fadexpr->fadexpr_);
  if (bVar5) {
    if (0 < (int)uVar7) {
      uVar8 = 0;
      do {
        vVar9 = FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>
                ::fastAccessDx(&fadexpr->fadexpr_,(int)uVar8);
        pdVar6[uVar8] = vVar9;
        uVar8 = uVar8 + 1;
      } while (uVar7 != uVar8);
    }
  }
  else if (0 < (int)uVar7) {
    uVar8 = 0;
    do {
      vVar9 = FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>
              ::dx(&fadexpr->fadexpr_,(int)uVar8);
      pdVar6[uVar8] = vVar9;
      uVar8 = uVar8 + 1;
    } while (uVar7 != uVar8);
  }
LAB_00e05137:
  pFVar3 = (fadexpr->fadexpr_).right_;
  pFVar4 = (pFVar3->fadexpr_).left_;
  this->val_ = ((fadexpr->fadexpr_).left_)->val_ /
               (((pFVar4->fadexpr_).left_)->val_ + ((pFVar4->fadexpr_).right_)->val_ +
               ((pFVar3->fadexpr_).right_)->val_);
  return this;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}